

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::OuterProduct>::
addCase<2,4>(MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::OuterProduct> *this,
            CaseContext *ctx,TestCaseGroup *group)

{
  char *__s;
  Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *func;
  PrecisionCase *node;
  allocator<char> local_39;
  string local_38;
  
  __s = dataTypeNameOf<tcu::Matrix<float,2,4>>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  func = (Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *)instance<vkt::shaderexecutor::Functions::OuterProduct<2,4>>();
  node = createFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,2,4>,tcu::Vector<float,2>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                   (ctx,&local_38,func);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)node);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void				addCase			(const CaseContext& ctx, TestCaseGroup* group) const
	{
		const char*	const name = dataTypeNameOf<Matrix<float, Rows, Cols> >();
		group->addChild(createFuncCase(ctx, name, instance<GenF<Rows, Cols> >()));
	}